

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreRecursive.cpp
# Opt level: O1

void mathCore::do_simplification(expression *a)

{
  const_iterator cVar1;
  ulong uVar2;
  expression *distTo;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  undefined4 extraout_var;
  expression *peVar6;
  expression *dst;
  expSet *this;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar7;
  expression *child;
  expression *local_28;
  _Alloc_node local_20;
  
  bVar3 = is_and(a);
  if (bVar3) {
    combine_and(a);
    cVar1._M_node = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_28 = *(expression **)(cVar1._M_node + 1);
    iVar5 = std::
            _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
            ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                *)&a->contents,cVar1);
    bVar3 = is_or(local_28);
  }
  else {
    bVar3 = is_or(a);
    if (!bVar3) {
      return;
    }
    combine_or(a);
    cVar1._M_node = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_28 = *(expression **)(cVar1._M_node + 1);
    iVar5 = std::
            _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
            ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                *)&a->contents,cVar1);
    bVar3 = is_and(local_28);
  }
  this = &a->contents;
  if (bVar3 == false) {
    return;
  }
  peVar6 = local_28;
  absorbtion_law(a,local_28);
  bVar3 = is_literal(local_28);
  if ((bVar3) || (bVar3 = is_var(local_28), distTo = local_28, bVar3)) goto LAB_00109b91;
  uVar2 = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  dst = a;
  if (uVar2 < 2) {
    if (uVar2 == 1) {
      dst = *(expression **)(iVar5._M_node + 1);
      goto LAB_00109b72;
    }
  }
  else {
LAB_00109b72:
    iVar4 = copy((EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)peVar6);
    distributive_law(a,distTo,(expression *)CONCAT44(extraout_var,iVar4));
  }
  delete_children(a);
LAB_00109b91:
  pVar7 = std::
          _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
          ::_M_get_insert_equal_pos(&this->_M_t,&local_28);
  peVar6 = (expression *)pVar7.first;
  local_20._M_t = &this->_M_t;
  std::
  _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
  ::
  _M_insert_<expression*const&,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
            ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
              *)this,(_Base_ptr)peVar6,pVar7.second,&local_28,&local_20);
  empty_expression((mathCore *)a,peVar6);
  return;
}

Assistant:

void mathCore::do_simplification(expression* a) {
	if (is_and(a)) {
		combine_and(a);

		auto iter = a->contents.begin();
		expression* child = *iter;
		iter = a->contents.erase(iter);	// Pop it!

		if (is_or(child)) {
			absorbtion_law(a, child);

			if (is_literal(child) || is_var(child)) {
				a->contents.insert(child); // Insert it back if its simple
			}
			else {
				// a is our original parent and where the answer needs to go, so we can't distribute it
				// we distribute a copy!
				if (a->contents.size() > 1) {
					distributive_law(a, child, mathCore::copy(a));
				}
				else if (a->contents.size() == 1) {
					distributive_law(a, child, mathCore::copy(*iter));	// Single variables distribute easily
				}

				delete_children(a);	// Remove everything from a
				a->contents.insert(child);	// Put in us!
			}
			empty_expression(a);
		}
	}
	else if (is_or(a)) {
		combine_or(a);

		auto iter = a->contents.begin();
		expression* child = *iter;
		iter = a->contents.erase(iter);	// Pop it!

		if (is_and(child)) {
			absorbtion_law(a, child);

			if (is_literal(child) || is_var(child)) {
				a->contents.insert(child); // Insert it back if its simple
			}
			else {
				// a is our original parent and where the answer needs to go, so we can't distribute it
				// we distribute a copy!
				if (a->contents.size() > 1) {
					distributive_law(a, child, mathCore::copy(a));
				}
				else if (a->contents.size() == 1) {
					distributive_law(a, child, mathCore::copy(*iter));	// Single variables distribute easily
				}

				
				delete_children(a);	// Remove everything from a
				a->contents.insert(child);
			}
			empty_expression(a);
		}
	}
}